

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

int __thiscall
nv::FloatImage::clone(FloatImage *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ushort uVar1;
  ushort uVar2;
  uint32 uVar3;
  undefined8 *puVar4;
  void *__dest;
  uint uVar5;
  
  puVar4 = (undefined8 *)operator_new(0x20);
  *puVar4 = &PTR__FloatImage_0024d850;
  puVar4[3] = 0;
  puVar4[1] = 0;
  *(undefined4 *)(puVar4 + 2) = 0;
  uVar1 = this->m_width;
  *(ushort *)(puVar4 + 1) = uVar1;
  uVar2 = this->m_height;
  *(ushort *)((long)puVar4 + 10) = uVar2;
  uVar3 = this->m_componentNum;
  *(uint32 *)((long)puVar4 + 0xc) = uVar3;
  *(uint32 *)(puVar4 + 2) = this->m_count;
  if (this->m_mem != (float *)0x0) {
    mem::free((void *)0x0);
    puVar4[3] = 0;
    *(ushort *)(puVar4 + 1) = uVar1;
    *(ushort *)((long)puVar4 + 10) = uVar2;
    *(uint32 *)((long)puVar4 + 0xc) = uVar3;
    uVar5 = (uint)uVar2 * (uint)uVar1 * uVar3;
    *(uint *)(puVar4 + 2) = uVar5;
    __dest = mem::malloc((ulong)uVar5 << 2);
    puVar4[3] = __dest;
    memcpy(__dest,this->m_mem,(ulong)this->m_count << 2);
  }
  return (int)puVar4;
}

Assistant:

FloatImage* FloatImage::clone() const
{
	FloatImage* copy = new FloatImage();
	copy->m_width = m_width;
	copy->m_height = m_height;
	copy->m_componentNum = m_componentNum;
	copy->m_count = m_count;
	
	if(m_mem)
	{
		copy->allocate(m_componentNum, m_width, m_height);
		memcpy(copy->m_mem, m_mem, m_count * sizeof(float));
	}
		
	return copy;
}